

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O1

void __thiscall Messages::Person::Person(Person *this,Person *from)

{
  undefined1 *this_00;
  Arena *pAVar1;
  
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined ***)this = &PTR__Person_0010ebb8;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->phones_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->phones_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->phones_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->phones_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::TypeHandler>
            (&(this->phones_).super_RepeatedPtrFieldBase,&(from->phones_).super_RepeatedPtrFieldBase
            );
  this_00 = &this->field_0x8;
  if ((*(ulong *)&from->field_0x8 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)this_00,
               (UnknownFieldSet *)((*(ulong *)&from->field_0x8 & 0xfffffffffffffffe) + 8));
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    pAVar1 = *(Arena **)this_00;
    if (((ulong)pAVar1 & 1) != 0) {
      pAVar1 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (&this->name_,pAVar1,(from->name_).ptr_);
  }
  (this->email_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
  ;
  if (((from->_has_bits_).has_bits_[0] & 2) != 0) {
    pAVar1 = *(Arena **)this_00;
    if (((ulong)pAVar1 & 1) != 0) {
      pAVar1 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (&this->email_,pAVar1,(from->email_).ptr_);
  }
  this->id_ = from->id_;
  return;
}

Assistant:

Person::Person(const Person& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      phones_(from.phones_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArena());
  }
  email_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_email()) {
    email_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_email(),
      GetArena());
  }
  id_ = from.id_;
  // @@protoc_insertion_point(copy_constructor:Messages.Person)
}